

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O1

GuardBuilder * __thiscall
r_exec::CTPX::find_guard_builder(CTPX *this,_Fact *cause,_Fact *consequent,uint64_t period)

{
  _Object *p_Var1;
  byte bVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64_t uVar10;
  uint64_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ushort uVar15;
  SGuardBuilder *unaff_R14;
  SGuardBuilder *pSVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Atom s_2;
  Atom s_1;
  Atom s;
  SGuardBuilder *local_70;
  undefined4 local_54;
  double local_50;
  uint local_48;
  float local_44;
  undefined4 local_40;
  undefined4 local_3c;
  SGuardBuilder *local_38;
  long *plVar8;
  
  iVar6 = (*(cause->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(cause,0);
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  (**(code **)(*plVar8 + 0x20))(plVar8,0);
  sVar5 = r_code::Atom::asOpcode();
  if (sVar5 == Opcodes::Cmd) {
    p_Var1 = (this->super__TPX).super_TPX.target.object;
    iVar6 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
              ((long *)CONCAT44(extraout_var_00,iVar6),3);
    local_44 = (float)r_code::Atom::asFloat();
    iVar6 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x20))
              ((long *)CONCAT44(extraout_var_01,iVar6),3);
    fVar17 = (float)r_code::Atom::asFloat();
    uVar14 = 2;
    (**(code **)(*plVar8 + 0x20))(plVar8,2);
    uVar7 = r_code::Atom::asIndex();
    pSVar16 = (SGuardBuilder *)(ulong)uVar7;
    (**(code **)(*plVar8 + 0x20))(plVar8,(ulong)pSVar16 & 0xffff);
    bVar2 = r_code::Atom::getAtomCount();
    local_38 = pSVar16;
    uVar13 = (uint)bVar2;
    if (bVar2 != 0) {
      local_50 = (double)(fVar17 - local_44);
      uVar12 = (uint)bVar2;
      local_48 = uVar12;
      do {
        uVar7 = uVar7 + 1;
        puVar9 = (undefined4 *)(**(code **)(*plVar8 + 0x20))(plVar8,uVar7 & 0xffff);
        local_3c = *puVar9;
        cVar3 = r_code::Atom::isFloat();
        uVar14 = 4;
        if (cVar3 != '\0') {
          fVar18 = (float)r_code::Atom::asFloat();
          cVar3 = r_code::Utils::Equal((double)fVar18,local_50);
          uVar14 = 0;
          if (cVar3 != '\0') {
            local_70 = (SGuardBuilder *)operator_new(0x20);
            uVar14 = 1;
            ACGuardBuilder::ACGuardBuilder((ACGuardBuilder *)local_70,period,(uint16_t)uVar7);
          }
        }
        r_code::Atom::~Atom((Atom *)&local_3c);
        pSVar16 = local_70;
        uVar13 = local_48;
        if ((uVar14 & 3) != 0) goto LAB_0019422a;
        uVar15 = (short)uVar12 - 1;
        uVar12 = (uint)uVar15;
      } while (uVar15 != 0);
      uVar14 = 2;
    }
LAB_0019422a:
    local_70 = pSVar16;
    if (uVar14 == 2) {
      if ((local_44 != 0.0) || (NAN(local_44))) {
        uVar7 = (int)local_38 + 1;
        uVar12 = 5;
        if ((ushort)uVar7 <= (ushort)uVar13) {
          local_50 = (double)(fVar17 / local_44);
          do {
            puVar9 = (undefined4 *)(**(code **)(*plVar8 + 0x20))(plVar8,uVar7 & 0xffff);
            local_40 = *puVar9;
            cVar3 = r_code::Atom::isFloat();
            uVar12 = 7;
            if (cVar3 != '\0') {
              fVar17 = (float)r_code::Atom::asFloat();
              cVar3 = r_code::Utils::Equal((double)fVar17,local_50);
              uVar12 = 0;
              if (cVar3 != '\0') {
                local_70 = (SGuardBuilder *)operator_new(0x20);
                uVar12 = 1;
                MCGuardBuilder::MCGuardBuilder
                          ((MCGuardBuilder *)local_70,period,(double)(uVar7 & 0xffff));
              }
            }
            r_code::Atom::~Atom((Atom *)&local_40);
            if ((uVar12 != 7) && (uVar12 != 0)) goto LAB_00194429;
            uVar15 = (ushort)uVar7;
            uVar7 = uVar7 + 1;
          } while (uVar15 != (ushort)uVar13);
          uVar12 = 5;
        }
LAB_00194429:
        uVar14 = 0;
        if (uVar12 != 5) {
          uVar14 = uVar12;
        }
      }
      else {
        uVar14 = 0;
      }
    }
    if (uVar14 != 0) {
      return (GuardBuilder *)local_70;
    }
  }
  else if (sVar5 == Opcodes::MkVal) {
    puVar9 = (undefined4 *)(**(code **)(*plVar8 + 0x20))(plVar8,3);
    local_54 = *puVar9;
    cVar3 = r_code::Atom::isFloat();
    if (cVar3 != '\0') {
      fVar17 = (float)r_code::Atom::asFloat();
      p_Var1 = (this->super__TPX).super_TPX.target.object;
      iVar6 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_02,iVar6),3);
      fVar18 = (float)r_code::Atom::asFloat();
      iVar6 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar6),3);
      fVar19 = (float)r_code::Atom::asFloat();
      local_50 = (double)CONCAT44(local_50._4_4_,fVar19 - fVar18);
      cVar4 = r_code::Utils::Equal((double)fVar17,(double)((fVar19 - fVar18) / (float)period));
      if (cVar4 == '\0') {
        if ((fVar18 != 0.0) || (NAN(fVar18))) {
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar11 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          unaff_R14 = (SGuardBuilder *)operator_new(0x28);
          MGuardBuilder::MGuardBuilder
                    ((MGuardBuilder *)unaff_R14,period,(double)(fVar19 / fVar18),uVar10 - uVar11);
        }
        else {
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar11 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          unaff_R14 = (SGuardBuilder *)operator_new(0x28);
          AGuardBuilder::AGuardBuilder
                    ((AGuardBuilder *)unaff_R14,period,(double)local_50._0_4_,uVar10 - uVar11);
        }
      }
      else {
        uVar10 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
        uVar11 = r_code::Utils::GetTimestamp<r_code::Code>
                           ((Code *)(this->super__TPX).super_TPX.target.object,2);
        unaff_R14 = (SGuardBuilder *)operator_new(0x20);
        SGuardBuilder::SGuardBuilder(unaff_R14,period,(period - uVar10) + uVar11);
      }
    }
    r_code::Atom::~Atom((Atom *)&local_54);
    if (cVar3 != '\0') {
      return (GuardBuilder *)unaff_R14;
    }
  }
  return (GuardBuilder *)(SGuardBuilder *)0x0;
}

Assistant:

GuardBuilder *CTPX::find_guard_builder(_Fact *cause, _Fact *consequent, uint64_t period)
{
    Code *cause_payload = cause->get_reference(0);
    uint16_t opcode = cause_payload->code(0).asOpcode();

    if (opcode == Opcodes::Cmd) { // form 0.
        float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float searched_for = q1 - q0;
        uint16_t cmd_arg_set_index = cause_payload->code(CMD_ARGS).asIndex();
        uint16_t cmd_arg_count = cause_payload->code(cmd_arg_set_index).getAtomCount();

        for (uint16_t i = 1; i <= cmd_arg_count; ++i) {
            Atom s = cause_payload->code(cmd_arg_set_index + i);

            if (!s.isFloat()) {
                continue;
            }

            float _s = s.asFloat();

            if (Utils::Equal(_s, searched_for)) {
                return new ACGuardBuilder(period, cmd_arg_set_index + i);
            }
        }

        if (q0 != 0) {
            searched_for = q1 / q0;

            for (uint16_t i = cmd_arg_set_index + 1; i <= cmd_arg_count; ++i) {
                Atom s = cause_payload->code(i);

                if (!s.isFloat()) {
                    continue;
                }

                float _s = s.asFloat();

                if (Utils::Equal(_s, searched_for)) {
                    return new MCGuardBuilder(period, i);
                }
            }
        }
    } else if (opcode == Opcodes::MkVal) {
        Atom s = cause_payload->code(MK_VAL_VALUE);

        if (s.isFloat()) {
            float _s = s.asFloat();
            float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float searched_for = (q1 - q0) / period;

            if (Utils::Equal(_s, searched_for)) { // form 1.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new SGuardBuilder(period, period - offset);
            }

            if (q0 != 0) { // form 2.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new MGuardBuilder(period, q1 / q0, offset);
            }

            uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
            return new AGuardBuilder(period, q1 - q0, offset);
        }
    }

    return nullptr;
}